

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O2

void __thiscall tchecker::clockbounds::local_m_map_t::clear(local_m_map_t *this)

{
  pointer ppmVar1;
  loc_id_t id;
  ulong uVar2;
  
  for (uVar2 = 0;
      ppmVar1 = (this->_M).
                super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start, uVar2 < this->_loc_nb; uVar2 = uVar2 + 1)
  {
    make_array_destruct_and_deallocate<int,4ul,tchecker::array_capacity_t<unsigned_int>>
              (ppmVar1[uVar2]);
  }
  if ((this->_M).
      super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppmVar1) {
    (this->_M).
    super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppmVar1;
  }
  this->_loc_nb = 0;
  this->_clock_nb = 0;
  return;
}

Assistant:

void local_m_map_t::clear()
{
  for (tchecker::loc_id_t id = 0; id < _loc_nb; ++id)
    tchecker::clockbounds::deallocate_map(_M[id]);
  _M.clear();
  _loc_nb = 0;
  _clock_nb = 0;
}